

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::tryExpandData
          (Group *this,uint oldLgSize,uint oldOffset,uint expansionFactor)

{
  uint uVar1;
  uint uVar2;
  DataLocation *pDVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  byte bVar7;
  ulong uVar8;
  DataLocationUsage *pDVar9;
  ulong uVar10;
  bool bVar11;
  Fault f;
  byte local_3c;
  Fault local_38;
  
  if ((expansionFactor + oldLgSize < 7) &&
     (uVar5 = ~(-1 << ((byte)expansionFactor & 0x1f)), (uVar5 & oldOffset) == 0)) {
    local_3c = 0;
  }
  else {
    pcVar6 = getenv("CAPNP_IGNORE_ISSUE_344");
    if (pcVar6 != (char *)0x0) {
      bVar7 = 0;
      goto LAB_00459636;
    }
    uVar5 = 1;
    local_3c = 1;
  }
  bVar7 = (byte)uVar5;
  pDVar9 = (this->parentDataLocationUsage).builder.ptr;
  bVar11 = (this->parentDataLocationUsage).builder.pos != pDVar9;
  if (bVar11) {
    uVar8 = 0;
    uVar10 = 1;
    do {
      pDVar3 = (this->parent->dataLocations).builder.ptr;
      uVar1 = pDVar3[uVar8].lgSize;
      bVar4 = true;
      bVar7 = (char)uVar1 - (char)oldLgSize;
      if (oldLgSize <= uVar1) {
        pDVar3 = pDVar3 + uVar8;
        uVar2 = pDVar3->offset;
        if (oldOffset >> (bVar7 & 0x1f) == uVar2) {
          bVar4 = DataLocationUsage::tryExpand
                            (pDVar9 + uVar8,this,pDVar3,oldLgSize,
                             oldOffset - (uVar2 << (bVar7 & 0x1f)),expansionFactor);
          uVar5 = (uint)bVar4;
          if ((local_3c & bVar4) == 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[180]>
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                       ,0x22c,FAILED,(char *)0x0,
                       "\"Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344\""
                       ,(char (*) [180])
                        "Bad news: Cap\'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344"
                      );
            kj::_::Debug::Fault::fatal(&local_38);
          }
          bVar4 = false;
        }
      }
      bVar7 = (byte)uVar5;
      if (!bVar4) break;
      pDVar9 = (this->parentDataLocationUsage).builder.ptr;
      uVar8 = (long)(this->parentDataLocationUsage).builder.pos - (long)pDVar9 >> 3;
      bVar11 = uVar10 < uVar8;
      bVar4 = uVar10 < uVar8;
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar4);
  }
  if (!bVar11) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x232,FAILED,(char *)0x0,"\"Tried to expand field that was never allocated.\"",
               (char (*) [48])"Tried to expand field that was never allocated.");
    kj::_::Debug::Fault::fatal(&local_38);
  }
LAB_00459636:
  return (bool)(bVar7 & 1);
}

Assistant:

bool tryExpandData(uint oldLgSize, uint oldOffset, uint expansionFactor) override {
      bool mustFail = false;
      if (oldLgSize + expansionFactor > 6 ||
          (oldOffset & ((1 << expansionFactor) - 1)) != 0) {
        // Expansion is not possible because the new size is too large or the offset is not
        // properly-aligned.

        // Unfortunately, Cap'n Proto 0.5.x and prior forgot to "return false" here, instead
        // continuing to execute the rest of the method. In most cases, the method failed later
        // on, causing no harm. But, in cases where the method later succeeded, it probably
        // led to bogus layouts. We cannot simply add the return statement now as this would
        // silently break backwards-compatibility with affected schemas. Instead, we detect the
        // problem and throw an exception.
        //
        // TODO(cleanup): Once sufficient time has elapsed, switch to "return false;" here.
        if (shouldDetectIssue344()) {
          mustFail = true;
        } else {
          return false;
        }
      }

      for (uint i = 0; i < parentDataLocationUsage.size(); i++) {
        auto& location = parent.dataLocations[i];
        if (location.lgSize >= oldLgSize &&
            oldOffset >> (location.lgSize - oldLgSize) == location.offset) {
          // The location we're trying to expand is a subset of this data location.
          auto& usage = parentDataLocationUsage[i];

          // Adjust the offset to be only within this location.
          uint localOldOffset = oldOffset - (location.offset << (location.lgSize - oldLgSize));

          // Try to expand.
          bool result = usage.tryExpand(
              *this, location, oldLgSize, localOldOffset, expansionFactor);
          if (mustFail && result) {
            KJ_FAIL_ASSERT("Bad news: Cap'n Proto 0.5.x and previous contained a bug which would cause this schema to be compiled incorrectly. Please see: https://github.com/sandstorm-io/capnproto/issues/344");
          }
          return result;
        }
      }

      KJ_FAIL_ASSERT("Tried to expand field that was never allocated.");
      return false;
    }